

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O3

long getIncrData(uchar **data,XSelectionEvent *selevent,long lower_bound)

{
  int iVar1;
  time_t tVar2;
  time_t tVar3;
  ulong __n;
  XSelectionEvent *pXVar4;
  long lVar5;
  XSelectionEvent *__size;
  uchar *prop;
  int actual_format;
  unsigned_long bytes_after;
  unsigned_long nitems;
  Atom actual_type;
  XEvent event;
  
  XDeleteProperty(fl_display,data[4],data[7]);
  fl_handle::sn_buffer = (uchar *)realloc(fl_handle::sn_buffer,(size_t)selevent);
  __size = (XSelectionEvent *)0x0;
  do {
    do {
      tVar2 = time((time_t *)0x0);
      while (iVar1 = XPending(), iVar1 == 0) {
        tVar3 = time((time_t *)0x0);
        if (10 < tVar3 - tVar2) goto LAB_001e3546;
      }
      XNextEvent(fl_display,&event);
      if (event.type != 0x1c) goto LAB_001e3546;
    } while (event.xexpose.count != 0);
    prop = (uchar *)0x0;
    lVar5 = 0;
    pXVar4 = __size;
    do {
      XGetWindowProperty(fl_display,data[4],data[7],lVar5,70000,1,0,&actual_type,&actual_format,
                         &nitems,&bytes_after,&prop);
      iVar1 = actual_format + 7;
      if (-1 < actual_format) {
        iVar1 = actual_format;
      }
      __n = (long)(iVar1 >> 3) * nitems;
      __size = (XSelectionEvent *)((long)&pXVar4->type + __n);
      if (selevent < __size) {
        fl_handle::sn_buffer = (uchar *)realloc(fl_handle::sn_buffer,(size_t)__size);
      }
      memcpy(fl_handle::sn_buffer + (long)pXVar4,prop,__n);
      if (prop != (uchar *)0x0) {
        XFree();
      }
      lVar5 = lVar5 + (__n >> 2);
      pXVar4 = __size;
    } while (bytes_after != 0);
  } while (__n != 0);
LAB_001e3546:
  XDeleteProperty(fl_display,data[4],data[7]);
  return (long)__size;
}

Assistant:

static long getIncrData(uchar* &data, const XSelectionEvent& selevent, long lower_bound)
{
//fprintf(stderr,"Incremental transfer starting due to INCR property\n");
  size_t total = 0;
  XEvent event;
  XDeleteProperty(fl_display, selevent.requestor, selevent.property);  
  data = (uchar*)realloc(data, lower_bound);
  for (;;)
  {
    if (!getNextEvent(&event)) break;
    if (event.type == PropertyNotify)
    {
      if (event.xproperty.state != PropertyNewValue) continue;
      Atom actual_type;
      int actual_format;
      unsigned long nitems;
      unsigned long bytes_after;
      unsigned char* prop = 0;
      long offset = 0;
      size_t num_bytes;
      //size_t slice_size = 0;
      do
      {
	XGetWindowProperty(fl_display, selevent.requestor, selevent.property, offset, 70000, True,
			   AnyPropertyType, &actual_type, &actual_format, &nitems, &bytes_after, &prop);
	num_bytes = nitems * (actual_format / 8);
	offset += num_bytes/4;
	//slice_size += num_bytes;
	if (total + num_bytes > (size_t)lower_bound) data = (uchar*)realloc(data, total + num_bytes);
	memcpy(data + total, prop, num_bytes); total += num_bytes;
	if (prop) XFree(prop);
      } while (bytes_after != 0);
//fprintf(stderr,"INCR data size:%ld\n", slice_size);
      if (num_bytes == 0) break;
    }
    else break;
  }
  XDeleteProperty(fl_display, selevent.requestor, selevent.property);
  return (long)total;
}